

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Codec.cpp
# Opt level: O2

string * __thiscall
higan::Codec::DecodeUrl_abi_cxx11_(string *__return_storage_ptr__,Codec *this,char *url,size_t len)

{
  uint uVar1;
  undefined1 *__s;
  undefined1 *__dest;
  Codec *begin;
  Codec *pCVar2;
  allocator<char> local_31;
  
  __s = (undefined1 *)operator_new__((ulong)(url + 1));
  memset(__s,0,(size_t)(url + 1));
  pCVar2 = (Codec *)(url + (long)this);
  __dest = __s;
  do {
    if (pCVar2 <= this) {
LAB_00128fdb:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char*>((string *)__return_storage_ptr__,__s,__dest);
      return __return_storage_ptr__;
    }
    uVar1 = (uint)(byte)*this;
    begin = this + 1;
    if (*this == (Codec)0x25) {
      if ((long)pCVar2 - (long)begin < 2) {
        if (pCVar2 != begin) {
          memmove(__dest,begin,(long)pCVar2 - (long)begin);
        }
        goto LAB_00128fdb;
      }
      uVar1 = HexCharArrayToInt((char *)begin,(char *)(this + 3));
      begin = this + 3;
      if (uVar1 == 0xffffffff) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"",&local_31);
        return __return_storage_ptr__;
      }
    }
    *__dest = (char)uVar1;
    __dest = __dest + 1;
    this = begin;
  } while( true );
}

Assistant:

std::string Codec::DecodeUrl(const char* url, size_t len)
{
	char* buffer = new char[len + 1]{};

	const char* url_ptr = url;
	const char* url_end = url + len;

	char* buffer_ptr = buffer;

	while (url_ptr < url_end)
	{
		if (*url_ptr == '%')
		{
			url_ptr++;
			/**
			 * % 后面需要有两位字符 不足两位说明存在问题 拷贝剩余字符后break
			 */
			if (url_end - url_ptr >= 2)
			{
				int num = HexCharArrayToInt(url_ptr, url_ptr + 2);
				if (num == -1)
				{
					return "";
				}
				*buffer_ptr++ = static_cast<char>(num);
				url_ptr += 2;
			}
			else
			{
				std::copy(url_ptr, url_end, buffer_ptr);
				break;
			}
		}
		else
		{
			*buffer_ptr++ = *url_ptr++;
		}
	}

	return std::string(buffer, buffer_ptr);
}